

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

size_t scriptint_to_bytes(int64_t signed_v,uchar *bytes_out)

{
  undefined1 uVar1;
  size_t local_38;
  byte local_29;
  size_t sStack_28;
  uchar last;
  size_t len;
  uint64_t v;
  uchar *bytes_out_local;
  int64_t signed_v_local;
  
  local_38 = signed_v;
  if (signed_v < 0) {
    local_38 = -signed_v;
  }
  sStack_28 = 0;
  local_29 = 0;
  v = (uint64_t)bytes_out;
  for (len = local_38; len != 0; len = len >> 8) {
    local_29 = (byte)len;
    *(byte *)v = local_29;
    sStack_28 = sStack_28 + 1;
    v = v + 1;
  }
  if ((local_29 & 0x80) == 0) {
    if (signed_v < 0) {
      *(byte *)(v - 1) = *(byte *)(v - 1) | 0x80;
    }
  }
  else {
    uVar1 = 0;
    if (signed_v < 0) {
      uVar1 = 0x80;
    }
    *(undefined1 *)v = uVar1;
    sStack_28 = sStack_28 + 1;
  }
  return sStack_28;
}

Assistant:

size_t scriptint_to_bytes(int64_t signed_v, unsigned char *bytes_out)
{
    uint64_t v = signed_v < 0 ? -signed_v : signed_v;
    size_t len = 0;
    unsigned char last = 0;

    while (v) {
        last = v & 0xff;
        *bytes_out++ = last;
        len += 1;
        v >>= 8;
    }
    if (last & 0x80) {
        *bytes_out = signed_v < 0 ? 0x80 : 0;
        ++len;
    } else if (signed_v < 0)
        bytes_out[-1] |= 0x80;
    return len;
}